

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VmaAllocHandle __thiscall
VmaBlockMetadata_TLSF::GetNextAllocation(VmaBlockMetadata_TLSF *this,VmaAllocHandle prevAlloc)

{
  Block *startBlock;
  
  do {
    prevAlloc = *(VmaAllocHandle *)(prevAlloc + 0x10);
    if (prevAlloc == (VmaAllocHandle)0x0) {
      return prevAlloc;
    }
  } while (*(VmaAllocHandle *)(prevAlloc + 0x20) != prevAlloc);
  return prevAlloc;
}

Assistant:

VmaAllocHandle VmaBlockMetadata_TLSF::GetNextAllocation(VmaAllocHandle prevAlloc) const
{
    Block* startBlock = (Block*)prevAlloc;
    VMA_ASSERT(!startBlock->IsFree() && "Incorrect block!");

    for (Block* block = startBlock->prevPhysical; block; block = block->prevPhysical)
    {
        if (!block->IsFree())
            return (VmaAllocHandle)block;
    }
    return VK_NULL_HANDLE;
}